

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# H22_radix_sort.c
# Opt level: O2

void sort(uint *A,uint *B,int n)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  int aiStack_11c [67];
  
  uVar4 = 0;
  uVar3 = 0;
  if (0 < n) {
    uVar3 = (ulong)(uint)n;
  }
  for (; uVar4 < 0x20; uVar4 = uVar4 + 6) {
    for (lVar5 = 0; lVar5 != 0x40; lVar5 = lVar5 + 1) {
      aiStack_11c[lVar5 + 1] = 0;
    }
    for (uVar6 = 0; uVar3 != uVar6; uVar6 = uVar6 + 1) {
      aiStack_11c[(ulong)(A[uVar6] >> ((byte)uVar4 & 0x1f) & 0x3f) + 1] =
           aiStack_11c[(ulong)(A[uVar6] >> ((byte)uVar4 & 0x1f) & 0x3f) + 1] + 1;
    }
    for (lVar5 = 1; uVar6 = (ulong)(uint)n, lVar5 != 0x40; lVar5 = lVar5 + 1) {
      aiStack_11c[lVar5 + 1] = aiStack_11c[lVar5 + 1] + aiStack_11c[lVar5];
    }
    for (; 0 < (int)uVar6; uVar6 = uVar6 - 1) {
      uVar1 = A[uVar6 - 1];
      uVar7 = (ulong)(uVar1 >> ((byte)uVar4 & 0x1f) & 0x3f);
      iVar2 = aiStack_11c[uVar7 + 1];
      aiStack_11c[uVar7 + 1] = iVar2 + -1;
      B[(long)iVar2 + -1] = uVar1;
    }
    for (uVar6 = 0; uVar3 != uVar6; uVar6 = uVar6 + 1) {
      A[uVar6] = B[uVar6];
    }
  }
  return;
}

Assistant:

void sort(unsigned int A[], unsigned int B[], int n) {
  int i, bit;
  int C[M];

  for (bit = 0; bit < 32; bit += 6) {
    for (i = 0; i < M; ++i) {
      C[i] = 0;
    }
    for (i = 0; i < n; ++i) {
      ++C[(A[i] >> bit) & MASK];
    }

    for (i = 1; i < M; ++i) {
      C[i] += C[i - 1];
    }

    for (i = n - 1; i >= 0; --i) {
      B[--C[(A[i] >> bit) & MASK]] = A[i];
    }

    for (i = 0; i < n; i++) {
      A[i] = B[i];
    }
  }
}